

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

int Mpm_ManDeriveCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  int *piVar1;
  Mig_Fan_t MVar2;
  Mmr_Step_t *pMVar3;
  Mpm_Cut_t *pMVar4;
  Mpm_Cut_t *pCut2;
  uint uVar5;
  Mig_Fan_t MVar6;
  Mpm_Cut_t *pMVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  undefined4 *puVar14;
  ulong uVar15;
  long lVar16;
  Mig_Obj_t *pMVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  Mpm_Uni_t *pMVar23;
  uint uVar24;
  ulong uVar25;
  Mpm_Cut_t *pCut;
  Mpm_Cut_t *local_38;
  
  uVar5 = (uint)pObj->pFans[3] >> 1;
  if (((int)uVar5 < (p->vRequireds).nSize) && ((int)uVar5 < (p->vCutBests).nSize)) {
    if ((p->vFreeUnits).nSize != p->nNumCuts + 1) {
      __assert_fail("Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x24e,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    if ((p->vCutLists).nSize <= (int)uVar5) goto LAB_0047f0f4;
    if ((p->vCutLists).pArray[uVar5] != 0) {
      __assert_fail("Mpm_ObjCutList(p, pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x24f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    uVar11 = (p->vRequireds).pArray[uVar5];
    uVar5 = (p->vCutBests).pArray[uVar5];
    p->nCutStore = 0;
    if (0 < (int)uVar5) {
      pMVar7 = Mpm_ObjCutBestP(p,(Mig_Obj_t *)(ulong)(uint)pObj->pFans[3]);
      uVar10 = 0;
      if (0x7ffffff < *(uint *)&pMVar7->field_0x4) {
        uVar25 = (ulong)(*(uint *)&pMVar7->field_0x4 >> 0x1b);
        uVar15 = 0;
        uVar10 = 0;
        do {
          if (pMVar7->pLeaves[uVar15] < 0) {
LAB_0047f01b:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar18 = p->pLibLut->pLutDelays[uVar25][uVar15] +
                   (p->vTimes).pArray[(uint)pMVar7->pLeaves[uVar15] >> 1];
          if ((int)uVar10 <= (int)uVar18) {
            uVar10 = (ulong)uVar18;
          }
          uVar15 = uVar15 + 1;
        } while (uVar25 != uVar15);
      }
      if (pMVar7->hNext != 0) {
        __assert_fail("pCut->hNext == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                      ,0x255,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
      }
      iVar21 = (int)uVar10;
      if ((int)uVar11 < iVar21) {
        printf("Arrival time (%d) exceeds required time (%d) at object %d.\n",uVar10,(ulong)uVar11);
      }
      if (p->fMainRun == 0) {
        uVar18 = (uint)pObj->pFans[3] >> 1;
        if ((p->vTimes).nSize <= (int)uVar18) goto LAB_0047f132;
        (p->vTimes).pArray[uVar18] = iVar21;
      }
      else {
        pMVar7 = Mpm_ManMergeCuts(p,pMVar7,(Mpm_Cut_t *)0x0,(Mpm_Cut_t *)0x0);
        Mpm_ObjAddCutToStore(p,pMVar7,iVar21);
      }
    }
    if (p->pMig->nChoices != 0) {
      uVar18 = (uint)pObj->pFans[3] >> 1;
      lVar12 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar18 & 0xfff) << 4)));
      if (*(int *)(lVar12 + 0x7c) != 0) {
        if (*(int *)(lVar12 + 0x7c) <= (int)uVar18) goto LAB_0047f0f4;
        uVar18 = *(uint *)(*(long *)(lVar12 + 0x80) + (ulong)uVar18 * 4);
        if (uVar18 != 0) {
          if (((int)uVar18 < 0) || (*(int *)(lVar12 + 8) <= (int)uVar18)) goto LAB_0047f0b6;
          if (*(int *)(lVar12 + 0x1c) <= (int)(uVar18 >> 0xc)) goto LAB_0047f059;
          Mpm_ObjAddChoiceCutsToStore
                    (p,pObj,(Mig_Obj_t *)
                            ((ulong)((uVar18 & 0xfff) << 4) +
                            *(long *)(*(long *)(lVar12 + 0x20) + (ulong)(uVar18 >> 0xc) * 8)),uVar11
                    );
        }
      }
    }
    lVar12 = 0;
    do {
      MVar2 = pObj->pFans[lVar12];
      if (0x7ffffffe < (uint)MVar2 >> 1) break;
      uVar19 = (uint)pObj->pFans[3] >> 1;
      uVar18 = (uint)MVar2 >> 1;
      if (uVar19 <= uVar18) goto LAB_0047f0d5;
      lVar16 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar19 & 0xfff) << 4)));
      if (*(int *)(lVar16 + 8) <= (int)uVar18) goto LAB_0047f0b6;
      if (*(int *)(lVar16 + 0x1c) <= (int)((uint)MVar2 >> 0xd)) goto LAB_0047f059;
      lVar16 = *(long *)(*(long *)(lVar16 + 0x20) + (ulong)((uint)MVar2 >> 0xd) * 8);
      if (lVar16 == 0) break;
      uVar18 = *(uint *)(lVar16 + 0xc + (ulong)((uVar18 & 0xfff) << 4)) >> 1;
      if ((p->vCutLists).nSize <= (int)uVar18) goto LAB_0047f0f4;
      uVar18 = (p->vCutLists).pArray[uVar18];
      if (uVar18 == 0) {
        lVar16 = 0;
      }
      else {
        pMVar3 = p->pManCuts;
        uVar19 = pMVar3->uMask;
        lVar16 = 0;
        do {
          uVar20 = uVar18 & uVar19;
          if ((int)uVar20 < 1) {
            __assert_fail("(h & p->uMask) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                          ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
          }
          uVar18 = (int)uVar18 >> ((byte)pMVar3->nBits & 0x1f);
          if ((int)uVar18 < 1) goto LAB_0047f03a;
          puVar14 = (undefined4 *)((long)pMVar3 + (ulong)uVar20 * 0x38 + 0x18);
          if ((int)(puVar14[7] << ((byte)*puVar14 & 0x1f)) <= (int)uVar18) goto LAB_0047f03a;
          uVar24 = uVar18 >> ((byte)*puVar14 & 0x1f);
          if ((int)puVar14[7] <= (int)uVar24) goto LAB_0047f059;
          lVar22 = *(long *)(*(long *)(puVar14 + 8) + (ulong)uVar24 * 8);
          if ((*(uint *)(lVar22 + 4 + (ulong)(uVar18 & puVar14[1]) * 8) >> 0x19) + 0xc >> 3 !=
              uVar20) {
            __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmInt.h"
                          ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
          }
          pMVar7 = (Mpm_Cut_t *)(lVar22 + (ulong)(uVar18 & puVar14[1]) * 8);
          p->pCuts[lVar12][lVar16] = pMVar7;
          if (*(uint *)&pMVar7->field_0x4 < 0x8000000) {
            uVar10 = 0;
          }
          else {
            uVar25 = 0;
            uVar10 = 0;
            do {
              if (pMVar7->pLeaves[uVar25] < 0) goto LAB_0047f01b;
              uVar10 = uVar10 | 1L << ((ulong)((uint)pMVar7->pLeaves[uVar25] >> 1 & 0x7f) & 0x3f);
              uVar25 = uVar25 + 1;
            } while (*(uint *)&pMVar7->field_0x4 >> 0x1b != uVar25);
          }
          p->pSigns[lVar12][lVar16] = uVar10;
          lVar16 = lVar16 + 1;
          uVar18 = pMVar7->hNext;
        } while (uVar18 != 0);
      }
      p->nCuts[lVar12] = (int)lVar16;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    if (0xfffffffd < (uint)pObj->pFans[1]) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x278,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    iVar21 = p->nCuts[0];
    if ((uint)pObj->pFans[2] < 0xfffffffe) {
      if (0 < iVar21) {
        lVar12 = 0;
        do {
          pMVar7 = p->pCuts[0][lVar12];
          if (pMVar7 == (Mpm_Cut_t *)0x0) break;
          iVar9 = p->nCuts[1];
          if (0 < iVar9) {
            lVar16 = 0;
            do {
              pMVar4 = p->pCuts[1][lVar16];
              if (pMVar4 == (Mpm_Cut_t *)0x0) break;
              iVar21 = p->nCuts[2];
              if (0 < iVar21) {
                lVar22 = 0;
                do {
                  pCut2 = p->pCuts[2][lVar22];
                  if (pCut2 == (Mpm_Cut_t *)0x0) break;
                  uVar10 = p->pSigns[1][lVar16] | p->pSigns[0][lVar12] | p->pSigns[2][lVar22];
                  uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
                  uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
                  uVar10 = (uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f;
                  uVar10 = (uVar10 >> 8) + uVar10;
                  lVar13 = (uVar10 >> 0x10) + uVar10;
                  if ((int)((int)((ulong)lVar13 >> 0x20) + (int)lVar13 & 0xffU) <= p->nLutSize) {
                    Mpm_ManExploreNewCut(p,pObj,pMVar7,pMVar4,pCut2,uVar11);
                    iVar21 = p->nCuts[2];
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 < iVar21);
                iVar9 = p->nCuts[1];
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < iVar9);
            iVar21 = p->nCuts[0];
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar21);
      }
    }
    else if (0 < iVar21) {
      lVar12 = 0;
      do {
        pMVar7 = p->pCuts[0][lVar12];
        if (pMVar7 == (Mpm_Cut_t *)0x0) break;
        iVar9 = p->nCuts[1];
        if (0 < iVar9) {
          lVar16 = 0;
          do {
            pMVar4 = p->pCuts[1][lVar16];
            if (pMVar4 == (Mpm_Cut_t *)0x0) break;
            uVar10 = p->pSigns[1][lVar16] | p->pSigns[0][lVar12];
            uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
            uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
            uVar10 = (uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f;
            uVar10 = (uVar10 >> 8) + uVar10;
            lVar22 = (uVar10 >> 0x10) + uVar10;
            if ((int)((int)((ulong)lVar22 >> 0x20) + (int)lVar22 & 0xffU) <= p->nLutSize) {
              Mpm_ManExploreNewCut(p,pObj,pMVar7,pMVar4,(Mpm_Cut_t *)0x0,uVar11);
              iVar9 = p->nCuts[1];
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < iVar9);
          iVar21 = p->nCuts[0];
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar21);
    }
    if (p->nCutStore < 1) {
      __assert_fail("p->nCutStore > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x27f,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    pMVar23 = p->pCutStore[0];
    if ((int)uVar11 < pMVar23->mTime) {
      if (p->fMainRun != 0) {
        __assert_fail("!p->fMainRun",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                      ,0x28b,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
      }
    }
    else {
      if (uVar5 != 0) {
        pMVar3 = p->pManCuts;
        pMVar3->nEntries = pMVar3->nEntries + -1;
        lVar12 = (long)(int)(pMVar3->uMask & uVar5) * 0x38;
        uVar5 = (int)uVar5 >> ((byte)pMVar3->nBits & 0x1f);
        piVar1 = (int *)((long)pMVar3 + lVar12 + 0x24);
        *piVar1 = *piVar1 + -1;
        if ((int)uVar5 < 1) {
LAB_0047f03a:
          __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                        ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
        }
        iVar21 = *(int *)((long)pMVar3 + lVar12 + 0x34);
        bVar8 = (byte)*(undefined4 *)((long)pMVar3 + lVar12 + 0x18);
        if (iVar21 << (bVar8 & 0x1f) <= (int)uVar5) goto LAB_0047f03a;
        uVar11 = uVar5 >> (bVar8 & 0x1f);
        if (iVar21 <= (int)uVar11) goto LAB_0047f059;
        memset((void *)((ulong)(*(uint *)((long)pMVar3 + lVar12 + 0x1c) & uVar5) * 8 +
                       *(long *)(*(long *)((long)pMVar3 + lVar12 + 0x38) + (ulong)uVar11 * 8)),0xff,
               (long)*(int *)((long)pMVar3 + lVar12 + 0x20) << 3);
        Vec_IntPush((Vec_Int_t *)((long)pMVar3 + lVar12 + 0x40),uVar5);
        pMVar23 = p->pCutStore[0];
      }
      uVar5 = Mpm_CutAlloc(p,*(uint *)&(pMVar23->pCut).field_0x4 >> 0x1b,&local_38);
      uVar18 = *(uint *)&(pMVar23->pCut).field_0x4 & 0x1ffffff;
      uVar11 = *(uint *)&local_38->field_0x4;
      *(uint *)&local_38->field_0x4 = uVar11 & 0xfe000000 | uVar18;
      uVar19 = *(uint *)&(pMVar23->pCut).field_0x4 & 0x2000000;
      *(uint *)&local_38->field_0x4 = uVar11 & 0xfc000000 | uVar18 | uVar19;
      uVar20 = *(uint *)&(pMVar23->pCut).field_0x4 & 0x4000000;
      *(uint *)&local_38->field_0x4 = uVar11 & 0xf8000000 | uVar18 | uVar19 | uVar20;
      *(uint *)&local_38->field_0x4 =
           uVar18 | uVar19 | uVar20 | *(uint *)&(pMVar23->pCut).field_0x4 & 0xf8000000;
      memcpy(local_38->pLeaves,(pMVar23->pCut).pLeaves,
             (ulong)(*(uint *)&(pMVar23->pCut).field_0x4 >> 0x19 & 0xfffffffc));
      uVar11 = (uint)pObj->pFans[3] >> 1;
      if ((p->vCutBests).nSize <= (int)uVar11) {
LAB_0047f132:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCutBests).pArray[uVar11] = uVar5;
      uVar11 = (uint)pObj->pFans[3] >> 1;
      if ((p->vTimes).nSize <= (int)uVar11) goto LAB_0047f132;
      pMVar23 = p->pCutStore[0];
      (p->vTimes).pArray[uVar11] = pMVar23->mTime;
      uVar11 = (uint)pObj->pFans[3] >> 1;
      if ((p->vAreas).nSize <= (int)uVar11) goto LAB_0047f132;
      (p->vAreas).pArray[uVar11] = pMVar23->mArea;
      uVar11 = (uint)pObj->pFans[3] >> 1;
      if ((p->vEdges).nSize <= (int)uVar11) goto LAB_0047f132;
      (p->vEdges).pArray[uVar11] = pMVar23->mEdge;
    }
    if ((int)uVar5 < 1) {
      __assert_fail("hCutBest > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x28c,"int Mpm_ManDeriveCuts(Mpm_Man_t *, Mig_Obj_t *)");
    }
    Mpm_ObjTranslateCutsFromStore(p,pObj);
    lVar12 = 0;
    do {
      MVar2 = pObj->pFans[lVar12];
      MVar6 = pObj->pFans[3];
      if (0x7ffffffe < (uint)MVar2 >> 1) goto LAB_0047ef4f;
      uVar5 = (uint)MVar2 >> 1;
      if ((uint)MVar6 >> 1 <= uVar5) {
LAB_0047f0d5:
        __assert_fail("i < 3 && Mig_FanId(p, i) < Mig_ObjId(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                      ,0xaa,"int Mig_ObjFaninId(Mig_Obj_t *, int)");
      }
      lVar16 = *(long *)((long)pObj + (-0x10 - (ulong)(((uint)MVar6 >> 1 & 0xfff) << 4)));
      if (*(int *)(lVar16 + 8) <= (int)uVar5) goto LAB_0047f0b6;
      if (*(int *)(lVar16 + 0x1c) <= (int)((uint)MVar2 >> 0xd)) goto LAB_0047f059;
      lVar16 = *(long *)(*(long *)(lVar16 + 0x20) + (ulong)((uint)MVar2 >> 0xd) * 8);
      if (lVar16 == 0) goto LAB_0047ef4f;
      pMVar17 = (Mig_Obj_t *)(lVar16 + (ulong)((uVar5 & 0xfff) << 4));
      if ((uint)pMVar17->pFans[1] < 0xfffffffe) {
        uVar5 = (uint)pMVar17->pFans[3] >> 1;
        if ((p->vMigRefs).nSize <= (int)uVar5) goto LAB_0047f113;
        piVar1 = (p->vMigRefs).pArray + uVar5;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Mpm_ObjRecycleCuts(p,pMVar17);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    MVar6 = pObj->pFans[3];
LAB_0047ef4f:
    uVar5 = (uint)MVar6 >> 1;
    lVar12 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar5 & 0xfff) << 4)));
    if (*(int *)(lVar12 + 0x7c) != 0) {
      if (*(int *)(lVar12 + 0x7c) <= (int)uVar5) goto LAB_0047f0f4;
      uVar5 = *(uint *)(*(long *)(lVar12 + 0x80) + (ulong)uVar5 * 4);
      if (uVar5 != 0) {
        if (((int)uVar5 < 0) || (*(int *)(lVar12 + 8) <= (int)uVar5)) {
LAB_0047f0b6:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                        ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
        }
        if (*(int *)(lVar12 + 0x1c) <= (int)(uVar5 >> 0xc)) {
LAB_0047f059:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar12 = *(long *)(*(long *)(lVar12 + 0x20) + (ulong)(uVar5 >> 0xc) * 8);
        if (lVar12 != 0) {
          pMVar17 = (Mig_Obj_t *)(lVar12 + (ulong)((uVar5 & 0xfff) << 4));
          uVar5 = (uint)pMVar17->pFans[3] >> 1;
          if ((p->vMigRefs).nSize <= (int)uVar5) {
LAB_0047f113:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar1 = (p->vMigRefs).pArray + uVar5;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Mpm_ObjRecycleCuts(p,pMVar17);
          }
        }
      }
    }
    uVar5 = (uint)pObj->pFans[3] >> 1;
    if ((int)uVar5 < (p->vMigRefs).nSize) {
      if ((p->vMigRefs).pArray[uVar5] == 0) {
        Mpm_ObjRecycleCuts(p,pObj);
      }
      return 1;
    }
  }
LAB_0047f0f4:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Mpm_ManDeriveCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut0, * pCut1, * pCut2;
    int Required = Mpm_ObjRequired( p, pObj );
    int hCutBest = Mpm_ObjCutBest( p, pObj );
    int c0, c1, c2;
#ifdef MIG_RUNTIME
abctime clk;
#endif

    assert( Vec_PtrSize( &p->vFreeUnits ) == p->nNumCuts + 1 );
    assert( Mpm_ObjCutList(p, pObj) == 0 );
    p->nCutStore = 0;
    if ( hCutBest > 0 ) // cut list is assigned
    {
        Mpm_Cut_t * pCut = Mpm_ObjCutBestP( p, pObj ); 
        int Times = Mpm_CutGetArrTime( p, pCut );
        assert( pCut->hNext == 0 );
        if ( Times > Required )
            printf( "Arrival time (%d) exceeds required time (%d) at object %d.\n", Times, Required, Mig_ObjId(pObj) );
        if ( p->fMainRun )
            Mpm_ObjAddCutToStore( p, Mpm_ManMergeCuts(p, pCut, NULL, NULL), Times );
        else
            Mpm_ObjSetTime( p, pObj, Times );
    }
    // start storage with choice cuts
    if ( Mig_ManChoiceNum(p->pMig) && Mig_ObjSiblId(pObj) )
        Mpm_ObjAddChoiceCutsToStore( p, pObj, Mig_ObjSibl(pObj), Required );

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjPrepareFanins( p, pObj );
    if ( Mig_ObjIsNode2(pObj) )
    {
        // go through cut pairs
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, NULL, Required ) )
                    goto finish;
    }
    else if ( Mig_ObjIsNode3(pObj) )
    {
        // go through cut triples
        for ( c0 = 0; c0 < p->nCuts[0] && (pCut0 = p->pCuts[0][c0]); c0++ )
        for ( c1 = 0; c1 < p->nCuts[1] && (pCut1 = p->pCuts[1][c1]); c1++ )
        for ( c2 = 0; c2 < p->nCuts[2] && (pCut2 = p->pCuts[2][c2]); c2++ )
            if ( Abc_TtCountOnes(p->pSigns[0][c0] | p->pSigns[1][c1] | p->pSigns[2][c2]) <= p->nLutSize )
                if ( !Mpm_ManExploreNewCut( p, pObj, pCut0, pCut1, pCut2, Required ) )
                    goto finish;
    }
    else assert( 0 );
#ifdef MIG_RUNTIME
p->timeDerive += Abc_Clock() - clk;
#endif

finish:
    // save best cut
    assert( p->nCutStore > 0 );
    if ( p->pCutStore[0]->mTime <= Required )
    {
        Mpm_Cut_t * pCut;
        if ( hCutBest )
            Mmr_StepRecycle( p->pManCuts, hCutBest );
        hCutBest = Mpm_CutCreate( p, &p->pCutStore[0]->pCut, &pCut );
        Mpm_ObjSetCutBest( p, pObj, hCutBest );
        Mpm_ObjSetTime( p, pObj, p->pCutStore[0]->mTime );
        Mpm_ObjSetArea( p, pObj, p->pCutStore[0]->mArea );
        Mpm_ObjSetEdge( p, pObj, p->pCutStore[0]->mEdge );
    }
    else assert( !p->fMainRun );
    assert( hCutBest > 0 );
    // transform internal storage into regular cuts
    Mpm_ObjTranslateCutsFromStore( p, pObj );
    // dereference fanin cuts and reference node
    Mpm_ObjDerefFaninCuts( p, pObj );
    return 1;
}